

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bozo.cpp
# Opt level: O0

void __thiscall Bozo::apply(Bozo *this,Vector *p,SurfaceData *t)

{
  double dVar1;
  bool bVar2;
  Vector local_88;
  Vector local_70;
  double local_58;
  double _noise;
  undefined1 local_38 [8];
  Vector bozo_turb;
  SurfaceData *t_local;
  Vector *p_local;
  Bozo *this_local;
  
  dVar1 = (this->super_Texture).turb;
  bozo_turb.z = (double)t;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    turbulence_3d((Vector *)local_38,p,(this->super_Texture).octaves);
    operator*((Vector *)&_noise,(Vector *)local_38,(this->super_Texture).turb);
    Vector::operator+=(p,(Vector *)&_noise);
  }
  local_58 = noise(p);
  bVar2 = ColorTable::is_empty(&this->tbl);
  if (bVar2) {
    if (0.4 <= local_58) {
      if (0.6 <= local_58) {
        if (0.8 <= local_58) {
          *(double *)((long)bozo_turb.z + 0x28) = *(double *)((long)bozo_turb.z + 0x28) + 1.0;
        }
        else {
          *(double *)((long)bozo_turb.z + 0x38) = *(double *)((long)bozo_turb.z + 0x38) + 1.0;
        }
      }
      else {
        *(double *)((long)bozo_turb.z + 0x30) = *(double *)((long)bozo_turb.z + 0x30) + 1.0;
      }
    }
    else {
      Vector::Vector(&local_88,1.0);
      Vector::operator+=((Vector *)((long)bozo_turb.z + 0x28),&local_88);
    }
  }
  else {
    ColorTable::find_color(&local_70,&this->tbl,local_58);
    Vector::operator+=((Vector *)((long)bozo_turb.z + 0x28),&local_70);
  }
  return;
}

Assistant:

void Bozo::apply( Vector& p, Grayzer::SurfaceData& t )
{
   if(   turb !=  0.0   )
   {
      Vector bozo_turb = turbulence_3d( p, octaves );
      p += bozo_turb * turb;
   }

   double _noise =   noise(p);

   if(   !tbl.is_empty()   )
   {
      // in POV, found color is added  to existing object color; why __??
      t.color  += tbl.find_color(_noise);
      return;
   }

   if(   _noise < 0.4 )
   {
      t.color  += 1.0;
      return;
   }
   if(   _noise < 0.6 )
   {
      t.color.y += 1.0;
      return;
   }
   if(   _noise < 0.8 )
   {
      t.color.z += 1.0;
      return;
   }

   t.color.x += 1.0;
   return;
}